

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::TypeSpecializeLdLen
          (GlobOpt *this,Instr **instrRef,Value **src1ValueRef,Value **dstValueRef,
          bool *forceInvariantHoistingRef)

{
  undefined2 baseValueType;
  ArrayRegOpnd *this_00;
  Instr *this_01;
  ValueInfo *this_02;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  bool bVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  StackSym *sym;
  RegOpnd *newSrc;
  Value *pVVar7;
  IntConstantBounds local_48;
  IntConstantBounds lengthConstantBounds;
  
  lengthConstantBounds = (IntConstantBounds)src1ValueRef;
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b3,"(instrRef)","instrRef");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  if (*instrRef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b5,"(instr)","instr");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  if ((*instrRef)->m_opcode != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b6,"(instr->m_opcode == Js::OpCode::LdLen_A)",
                       "instr->m_opcode == Js::OpCode::LdLen_A");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  if (lengthConstantBounds == (IntConstantBounds)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b7,"(src1ValueRef)","src1ValueRef");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  if (dstValueRef == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29b9,"(dstValueRef)","dstValueRef");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  if (forceInvariantHoistingRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x29bb,"(forceInvariantHoistingRef)","forceInvariantHoistingRef");
    if (!bVar2) goto LAB_004644bc;
    *puVar6 = 0;
  }
  baseValueType = (*instrRef)->m_src1->m_valueType;
  bVar2 = DoLdLenIntSpec(this,*instrRef,(ValueType)baseValueType);
  if (!bVar2) {
    return bVar2;
  }
  BVar5 = BailOutOnIrregularLength;
  if (this->prePassLoop != (Loop *)0x0) goto LAB_0046447e;
  this_00 = (ArrayRegOpnd *)(*instrRef)->m_src1;
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_004644bc;
    *puVar6 = 0;
  }
  bVar4 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
  if (bVar4) {
    bVar4 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar4) goto LAB_004644bc;
      *puVar6 = 0;
    }
    sym = IR::ArrayRegOpnd::LengthSym(this_00);
    if (sym == (StackSym *)0x0) goto LAB_004643e4;
    CaptureByteCodeSymUses(this,*instrRef);
    this_01 = *instrRef;
    this_01->m_opcode = Ld_I4;
    newSrc = IR::RegOpnd::New(sym,sym->m_type,this->func);
    IR::Instr::ReplaceSrc1(this_01,&newSrc->super_Opnd);
    IR::Instr::ClearBailOutInfo(*instrRef);
    pVVar7 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&sym->super_Sym);
    if (pVVar7 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x29d3,"(lengthValue)","lengthValue");
      if (!bVar4) goto LAB_004644bc;
      *puVar6 = 0;
    }
    *(Value **)lengthConstantBounds = pVVar7;
    this_02 = pVVar7->valueInfo;
    local_48.lowerBound = 0;
    local_48.upperBound = 0;
    bVar4 = ValueInfo::TryGetIntConstantBounds(this_02,&local_48,false);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x29d7,"(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds))"
                         ,"lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds)");
      if (!bVar4) goto LAB_004644bc;
      *puVar6 = 0;
    }
    if (local_48.lowerBound < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x29d8,"(lengthConstantBounds.LowerBound() >= 0)",
                         "lengthConstantBounds.LowerBound() >= 0");
      if (!bVar4) goto LAB_004644bc;
      *puVar6 = 0;
    }
    if ((StackSym *)this_02->symStore == sym) {
      this_02->symStore = (Sym *)0x0;
    }
    bVar4 = false;
    TypeSpecializeIntDst
              (this,*instrRef,LdLen_A,*(Value **)lengthConstantBounds,
               *(Value **)lengthConstantBounds,(Value *)0x0,BailOutOnIrregularLength,
               local_48.lowerBound,local_48.upperBound,dstValueRef,(AddSubConstantInfo *)0x0);
    *forceInvariantHoistingRef = true;
    BVar5 = BailOutOnIrregularLength;
  }
  else {
LAB_004643e4:
    if (((*instrRef)->field_0x38 & 0x10) == 0) {
      BVar5 = BailOutOnIrregularLength;
      GenerateBailAtOperation(this,instrRef,BailOutOnIrregularLength);
    }
    else {
      BVar5 = IR::Instr::GetBailOutKind(*instrRef);
      if (BVar5 != BailOutMarkTempObject) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x29f6,"(instr->GetBailOutKind() == IR::BailOutMarkTempObject)",
                           "instr->GetBailOutKind() == IR::BailOutMarkTempObject");
        if (!bVar4) {
LAB_004644bc:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      BVar5 = BailOutMarkTempObject|BailOutOnIrregularLength;
      IR::Instr::SetBailOutKind(*instrRef,BailOutMarkTempObject|BailOutOnIrregularLength);
    }
    bVar4 = true;
  }
  if (!bVar4) {
    return bVar2;
  }
LAB_0046447e:
  TypeSpecializeIntDst
            (this,*instrRef,LdLen_A,(Value *)0x0,(Value *)0x0,(Value *)0x0,BVar5,0,0x7fffffff,
             dstValueRef,(AddSubConstantInfo *)0x0);
  return bVar2;
}

Assistant:

bool
GlobOpt::TypeSpecializeLdLen(
    IR::Instr * *const instrRef,
    Value * *const src1ValueRef,
    Value * *const dstValueRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(src1ValueRef);
    Value *&src1Value = *src1ValueRef;
    Assert(dstValueRef);
    Value *&dstValue = *dstValueRef;
    Assert(forceInvariantHoistingRef);
    bool &forceInvariantHoisting = *forceInvariantHoistingRef;

    if(!DoLdLenIntSpec(instr, instr->GetSrc1()->GetValueType()))
    {
        return false;
    }

    IR::BailOutKind bailOutKind = IR::BailOutOnIrregularLength;
    if(!IsLoopPrePass())
    {
        IR::RegOpnd *const baseOpnd = instr->GetSrc1()->AsRegOpnd();
        if(baseOpnd->IsArrayRegOpnd())
        {
            StackSym *const lengthSym = baseOpnd->AsArrayRegOpnd()->LengthSym();
            if(lengthSym)
            {
                CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Ld_I4;
                instr->ReplaceSrc1(IR::RegOpnd::New(lengthSym, lengthSym->GetType(), func));
                instr->ClearBailOutInfo();

                // Find the hoisted length value
                Value *const lengthValue = CurrentBlockData()->FindValue(lengthSym);
                Assert(lengthValue);
                src1Value = lengthValue;
                ValueInfo *const lengthValueInfo = lengthValue->GetValueInfo();
                IntConstantBounds lengthConstantBounds;
                AssertVerify(lengthValueInfo->TryGetIntConstantBounds(&lengthConstantBounds));
                Assert(lengthConstantBounds.LowerBound() >= 0);

                if (lengthValueInfo->GetSymStore() == lengthSym)
                {
                    // When type specializing the dst below, we will end up inserting lengthSym.u32 as symstore for a var
                    // Clear the symstore here, so that we dont end up with problems with copyprop later on
                    lengthValueInfo->SetSymStore(nullptr);
                }

                // Int-specialize, and transfer the value to the dst
                TypeSpecializeIntDst(
                    instr,
                    Js::OpCode::LdLen_A,
                    src1Value,
                    src1Value,
                    nullptr,
                    bailOutKind,
                    lengthConstantBounds.LowerBound(),
                    lengthConstantBounds.UpperBound(),
                    &dstValue);

                // Try to force hoisting the Ld_I4 so that the length will have an invariant sym store that can be
                // copy-propped. Invariant hoisting does not automatically hoist Ld_I4.
                forceInvariantHoisting = true;
                return true;
            }
        }

        if (instr->HasBailOutInfo())
        {
            Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
            bailOutKind = IR::BailOutOnIrregularLength | IR::BailOutMarkTempObject;
            instr->SetBailOutKind(bailOutKind);
        }
        else
        {
            Assert(bailOutKind == IR::BailOutOnIrregularLength);
            GenerateBailAtOperation(&instr, bailOutKind);
        }
    }

    TypeSpecializeIntDst(
        instr,
        Js::OpCode::LdLen_A,
        nullptr,
        nullptr,
        nullptr,
        bailOutKind,
        0,
        INT32_MAX,
        &dstValue);
    return true;
}